

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLTraits.cpp
# Opt level: O0

StringRef llvm::yaml::ScalarTraits<signed_char,_void>::input
                    (StringRef Scalar,void *param_2,int8_t *Val)

{
  bool bVar1;
  longlong *in_R8;
  StringRef Str;
  long local_40;
  longlong N;
  int8_t *Val_local;
  void *param_1_local;
  StringRef Scalar_local;
  
  Str.Data = (char *)Scalar.Length;
  param_1_local = Scalar.Data;
  Str.Length = 0;
  N = (longlong)Val;
  Val_local = (int8_t *)param_2;
  Scalar_local.Data = Str.Data;
  bVar1 = getAsSignedInteger((llvm *)param_1_local,Str,(uint)&local_40,in_R8);
  if (bVar1) {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"invalid number");
  }
  else if ((local_40 < 0x80) && (-0x81 < local_40)) {
    *(char *)N = (char)local_40;
    memset(&Scalar_local.Length,0,0x10);
    StringRef::StringRef((StringRef *)&Scalar_local.Length);
  }
  else {
    StringRef::StringRef((StringRef *)&Scalar_local.Length,"out of range number");
  }
  return stack0xffffffffffffffe8;
}

Assistant:

StringRef ScalarTraits<int8_t>::input(StringRef Scalar, void *, int8_t &Val) {
  long long N;
  if (getAsSignedInteger(Scalar, 0, N))
    return "invalid number";
  if ((N > 127) || (N < -128))
    return "out of range number";
  Val = N;
  return StringRef();
}